

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex.cc
# Opt level: O0

void __thiscall fizplex::Simplex::set_basic_solution(Simplex *this,Base *base)

{
  bool bVar1;
  size_type sVar2;
  double *pdVar3;
  DVector *in_RDI;
  LP *unaff_retaddr;
  size_t i_1;
  unsigned_long i;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1;
  DVector beta;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  ColMatrix *in_stack_ffffffffffffff40;
  double dVar4;
  size_t *in_stack_ffffffffffffff48;
  DVector *in_stack_ffffffffffffff50;
  SVector *in_stack_ffffffffffffff58;
  DVector *in_stack_ffffffffffffff60;
  size_type sVar5;
  size_type local_78;
  SVector *in_stack_ffffffffffffff90;
  double in_stack_ffffffffffffff98;
  DVector *in_stack_ffffffffffffffa8;
  Base *in_stack_ffffffffffffffb0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_38;
  size_t *local_30;
  DVector *x;
  
  x = in_RDI;
  DVector::DVector((DVector *)in_stack_ffffffffffffff40,
                   (DVector *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  local_30 = &in_RDI[1].dim;
  local_38._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             *)in_stack_ffffffffffffff40,
                            (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38)), bVar1
        ) {
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator*(&local_38);
    DVector::operator[](in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48);
    ColMatrix::column(in_stack_ffffffffffffff40,
                      CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    fizplex::operator*(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    DVector::operator-=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    SVector::~SVector((SVector *)0x1eacb6);
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&local_38);
  }
  Base::ftran(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  local_78 = 0;
  while (sVar5 = local_78,
        sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&in_RDI->dim),
        sVar5 < sVar2) {
    pdVar3 = DVector::operator[](in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48);
    dVar4 = *pdVar3;
    in_stack_ffffffffffffff48 = &in_RDI[2].dim;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&in_RDI->dim,local_78);
    in_stack_ffffffffffffff50 =
         (DVector *)DVector::operator[](in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48)
    ;
    (in_stack_ffffffffffffff50->vals)._M_size = (size_t)dVar4;
    local_78 = local_78 + 1;
  }
  if ((*(int *)((long)&in_RDI[5].vals._M_size + 4) == 1) &&
     (bVar1 = LP::is_feasible(unaff_retaddr,x), !bVar1)) {
    __assert_fail("lp.is_feasible(x)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/simplex.cc"
                  ,0x78,"void fizplex::Simplex::set_basic_solution(Base &)");
  }
  DVector::~DVector((DVector *)0x1eae16);
  return;
}

Assistant:

void Simplex::set_basic_solution(Base &base) {
  DVector beta = lp.b;
  for (auto i : non_basic_indices)
    beta -= x[i] * lp.A.column(i);
  base.ftran(beta);

  for (size_t i = 0; i < basic_indices.size(); i++)
    x[basic_indices[i]] = beta[i];

  if (phase == Phase::Two)
    assert(lp.is_feasible(x));
}